

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[10],short,char>(JObject *this,char (*k) [10],short *v,char *c)

{
  ostream *os;
  char (*local_40) [10];
  Field<char[10],_short> field;
  
  local_40 = k;
  field.k = (char (*) [10])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (short *)&local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[10],_short>,_char> *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }